

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O1

UnitNode * enqueue(UnitList *queue,void *unit)

{
  int iVar1;
  UnitNode *pUVar2;
  UnitNode *pUVar3;
  
  pUVar3 = (UnitNode *)malloc(0x18);
  pUVar3->unit = unit;
  iVar1 = queue->count;
  if (iVar1 == 0) {
    queue->head = pUVar3;
    queue->tail = pUVar3;
    pUVar3->next = (UnitNode *)0x0;
    pUVar3->prev = (UnitNode *)0x0;
  }
  else {
    pUVar2 = queue->head;
    pUVar3->next = pUVar2;
    pUVar3->prev = (UnitNode *)0x0;
    queue->head = pUVar3;
    pUVar2->prev = pUVar3;
  }
  queue->count = iVar1 + 1;
  return pUVar3;
}

Assistant:

struct UnitNode *enqueue(struct UnitList *queue, void *unit) {

    struct UnitNode *newNode = malloc(sizeof(struct UnitNode));
    newNode->unit = unit;

    if (queue->count) {
        newNode->next = queue->head;
        newNode->prev = NULL;
        queue->head = newNode;
        queue->head->next->prev = newNode;

    } else {
        queue->head = newNode;
        queue->tail = newNode;
        newNode->next = NULL;
        newNode->prev = NULL;
    }

    queue->count++;

    return newNode;

}